

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O0

void Gia_ManCompareValues(Gia_Man_t *p,Vec_Wrd_t *vSimsIn,Vec_Int_t *vValues,char *pDumpFile)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pObj;
  word *p_00;
  uint local_6c;
  word *pSims;
  uint local_38;
  int nWords;
  int Count;
  int Guess;
  int Value;
  int i;
  char *pDumpFile_local;
  Vec_Int_t *vValues_local;
  Vec_Wrd_t *vSimsIn_local;
  Gia_Man_t *p_local;
  
  local_38 = 0;
  iVar1 = Vec_WrdSize(vSimsIn);
  iVar2 = Gia_ManCiNum(p);
  iVar1 = iVar1 / iVar2;
  iVar2 = Vec_IntSize(vValues);
  if (iVar2 != iVar1 << 6) {
    __assert_fail("Vec_IntSize(vValues) == nWords * 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x1a1,"void Gia_ManCompareValues(Gia_Man_t *, Vec_Wrd_t *, Vec_Int_t *, char *)")
    ;
  }
  Gia_ManSimulateWordsInit(p,vSimsIn);
  if (p->nSimWords == iVar1) {
    pObj = Gia_ManCo(p,0);
    iVar2 = Gia_ObjId(p,pObj);
    p_00 = Gia_ManObjSim(p,iVar2);
    for (Guess = 0; iVar2 = Vec_IntSize(vValues), Guess < iVar2; Guess = Guess + 1) {
      iVar2 = Vec_IntEntry(vValues,Guess);
      iVar4 = Abc_TtGetBit(p_00,Guess);
      if (iVar4 == iVar2) {
        local_38 = local_38 + 1;
      }
    }
    iVar2 = Vec_IntSum(vValues);
    if (iVar1 * 0x20 < iVar2) {
      local_6c = Vec_IntSum(vValues);
    }
    else {
      iVar2 = Vec_IntSum(vValues);
      local_6c = iVar1 * 0x40 - iVar2;
    }
    uVar3 = Vec_IntSize(vValues);
    iVar2 = Vec_IntSize(vValues);
    iVar1 = Vec_IntSize(vValues);
    iVar4 = Vec_IntSize(vValues);
    printf("Total = %6d.  Errors = %6d.  Correct = %6d.  (%6.2f %%)   Naive guess = %6d.  (%6.2f %%)\n"
           ,((double)(int)local_38 * 100.0) / (double)iVar1,
           ((double)(int)local_6c * 100.0) / (double)iVar4,(ulong)uVar3,(ulong)(iVar2 - local_38),
           (ulong)local_38,(ulong)local_6c);
    if (pDumpFile != (char *)0x0) {
      iVar2 = Vec_IntSize(vValues);
      Gia_ManSimLogStats(p,pDumpFile,iVar2,local_38,local_6c);
      printf("Finished dumping statistics into file \"%s\".\n",pDumpFile);
    }
    return;
  }
  __assert_fail("p->nSimWords == nWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                ,0x1a3,"void Gia_ManCompareValues(Gia_Man_t *, Vec_Wrd_t *, Vec_Int_t *, char *)");
}

Assistant:

void Gia_ManCompareValues( Gia_Man_t * p, Vec_Wrd_t * vSimsIn, Vec_Int_t * vValues, char * pDumpFile )
{
    int i, Value, Guess, Count = 0, nWords = Vec_WrdSize(vSimsIn) / Gia_ManCiNum(p);
    word * pSims;
    assert( Vec_IntSize(vValues) == nWords * 64 );
    Gia_ManSimulateWordsInit( p, vSimsIn );
    assert( p->nSimWords == nWords );
    pSims = Gia_ManObjSim( p, Gia_ObjId(p, Gia_ManCo(p, 0)) );
    Vec_IntForEachEntry( vValues, Value, i )
        if ( Abc_TtGetBit(pSims, i) == Value )
            Count++;
    Guess = (Vec_IntSum(vValues) > nWords * 32) ? Vec_IntSum(vValues) : nWords * 64 - Vec_IntSum(vValues);
    printf( "Total = %6d.  Errors = %6d.  Correct = %6d.  (%6.2f %%)   Naive guess = %6d.  (%6.2f %%)\n", 
        Vec_IntSize(vValues), Vec_IntSize(vValues) - Count, 
        Count, 100.0*Count/Vec_IntSize(vValues),
        Guess, 100.0*Guess/Vec_IntSize(vValues));
    if ( pDumpFile == NULL )
        return;
    Gia_ManSimLogStats( p, pDumpFile, Vec_IntSize(vValues), Count, Guess );
    printf( "Finished dumping statistics into file \"%s\".\n", pDumpFile );
}